

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

Template * ctemplate::Template::StringToTemplate(TemplateString *content,Strip strip)

{
  ulong __n;
  bool bVar1;
  Template *this;
  size_t content_len;
  char *buffer;
  ulong local_58;
  TemplateString local_50;
  
  this = (Template *)operator_new(0xc0);
  local_50.ptr_ = "";
  local_50.length_ = 0;
  local_50.is_immutable_ = false;
  local_50.id_ = 0;
  Template(this,&local_50,strip,(TemplateCache *)0x0);
  __n = content->length_;
  local_50.ptr_ = (char *)operator_new__(__n);
  local_58 = __n;
  memcpy(local_50.ptr_,content->ptr_,__n);
  StripBuffer(this,&local_50.ptr_,&local_58);
  bVar1 = BuildTree(this,local_50.ptr_,local_50.ptr_ + local_58);
  if (bVar1) {
    if (this->state_ != TS_READY) {
      __assert_fail("tpl->state() == TS_READY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                    ,0x865,
                    "static Template *ctemplate::Template::StringToTemplate(const TemplateString &, Strip)"
                   );
    }
  }
  else {
    if (this->state_ == TS_READY) {
      __assert_fail("tpl->state() != TS_READY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                    ,0x867,
                    "static Template *ctemplate::Template::StringToTemplate(const TemplateString &, Strip)"
                   );
    }
    (*this->_vptr_Template[1])(this);
    this = (Template *)0x0;
  }
  return this;
}

Assistant:

Template* Template::StringToTemplate(const TemplateString& content,
                                     Strip strip) {
  // An empty original_filename_ keeps ReloadIfChangedLocked from performing
  // file operations.

  Template *tpl = new Template("", strip, NULL);

  // But we have to do the "loading" and parsing ourselves:

  // BuildTree deletes the buffer when done, so we need a copy for it.
  char* buffer = new char[content.size()];
  size_t content_len = content.size();
  memcpy(buffer, content.data(), content_len);
  tpl->StripBuffer(&buffer, &content_len);
  if ( tpl->BuildTree(buffer, buffer + content_len) ) {
    assert(tpl->state() == TS_READY);
  } else {
    assert(tpl->state() != TS_READY);
    delete tpl;
    return NULL;
  }
  return tpl;
}